

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

int Deg(int v,int W)

{
  int local_14;
  int d;
  int W_local;
  int v_local;
  
  d = 1;
  while( true ) {
    if (0x1e < (uint)d) {
      return -1;
    }
    if ((f[d + -1] <= v) && (v < f[d])) break;
    d = d + 1;
  }
  if (W + -2 < d) {
    local_14 = W + -2;
  }
  else {
    local_14 = d;
  }
  return local_14;
}

Assistant:

static int Deg(int v, int W)
{
	assert(0 <= v);
	assert(v < (1 << 20));

	for (int d = 1; d < sizeof(f)/sizeof(f[0]); ++d) {
		if (f[d - 1] <= v && v < f[d]) {
			return ((d <= W - 2) ? d : (W - 2));
		}
	}
	assert(0); // Should never happen, given the precondition.
	return -1;
}